

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_word_wrapper.cpp
# Opt level: O0

void __thiscall
WordWrapper_TwoLines_Test::WordWrapper_TwoLines_Test(WordWrapper_TwoLines_Test *this)

{
  WordWrapper_TwoLines_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__WordWrapper_TwoLines_Test_00248298;
  return;
}

Assistant:

TEST (WordWrapper, TwoLines) {
    std::string const text = "one two";

    std::vector<std::string> lines;
    // Note this loop it hand-written to ensure that the test operations don't vary according to the
    // implementation of standard library functions.
    auto it = word_wrapper (text, 4);
    auto end = word_wrapper::end (text, 4);
    while (it != end) {
        std::string const & s = *it;
        lines.push_back (s);
        ++it;
    }
    EXPECT_THAT (lines, ::testing::ElementsAre ("one", "two"));
}